

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O0

void __thiscall
ExprTest_EqualCountExpr_Test::~ExprTest_EqualCountExpr_Test(ExprTest_EqualCountExpr_Test *this)

{
  void *in_RDI;
  
  ~ExprTest_EqualCountExpr_Test((ExprTest_EqualCountExpr_Test *)0x14afe8);
  operator_delete(in_RDI,0x58);
  return;
}

Assistant:

TEST_F(ExprTest, EqualCountExpr) {
  LogicalExpr args[] = {l0, l1, l1};
  NumericExpr e = MakeCount(args);
  // args2 is used to make sure that Equal compares expressions structurally
  // instead of comparing pointers; don't replace with args.
  LogicalExpr args2[] = {
    factory_.MakeLogicalConstant(false),
    factory_.MakeLogicalConstant(true),
    factory_.MakeLogicalConstant(true)
  };
  EXPECT_TRUE(Equal(e, MakeCount(args2)));
  LogicalExpr args3[] = {l0, l1};
  EXPECT_FALSE(Equal(e, MakeCount(args3)));
  EXPECT_FALSE(Equal(MakeCount(args3), e));
  NumericExpr args4[] = {MakeConst(0), MakeConst(1), MakeConst(1)};
  EXPECT_FALSE(Equal(e, MakeIterated(expr::SUM, args4)));
  LogicalExpr args5[] = {l0, l1, l0};
  EXPECT_FALSE(Equal(e, MakeCount(args5)));
}